

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy
               (string *tgtName,cmMessenger *messenger,cmListFileBacktrace *context)

{
  MessageType t;
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  string local_210;
  string local_1f0;
  cmStateSnapshot local_1c0;
  MessageType local_1a4;
  char *pcStack_1a0;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  string *tgtName_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
  pcStack_1a0 = (char *)0x0;
  local_1a4 = AUTHOR_WARNING;
  cmListFileBacktrace::GetBottom(&local_1c0,context);
  PVar1 = cmStateSnapshot::GetPolicy(&local_1c0,CMP0026,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x1a,id);
      poVar2 = std::operator<<((ostream *)&modal,(string *)&local_1f0);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_1f0);
      pcStack_1a0 = "should";
    }
    else if (PVar1 - NEW < 3) {
      pcStack_1a0 = "may";
      local_1a4 = FATAL_ERROR;
    }
  }
  if (pcStack_1a0 != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&modal,"The LOCATION property ");
    poVar2 = std::operator<<(poVar2,pcStack_1a0);
    poVar2 = std::operator<<(poVar2," not be read from target \"");
    poVar2 = std::operator<<(poVar2,(string *)tgtName);
    std::operator<<(poVar2,
                    "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                   );
    t = local_1a4;
    std::__cxx11::ostringstream::str();
    cmMessenger::IssueMessage(messenger,t,&local_210,context);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar3 = local_1a4 != FATAL_ERROR;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  std::ostringstream e;
  const char* modal = nullptr;
  MessageType messageType = MessageType::AUTHOR_WARNING;
  switch (context.GetBottom().GetPolicy(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = MessageType::FATAL_ERROR;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    messenger->IssueMessage(messageType, e.str(), context);
  }

  return messageType != MessageType::FATAL_ERROR;
}